

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_tidy(_glist *x)

{
  int iVar1;
  int iVar2;
  void *data;
  t_selection *ptVar3;
  int iVar4;
  long lVar5;
  t_gobj *ptVar6;
  t_gobj *ptVar7;
  bool bVar8;
  int by1;
  int bx1;
  int ay1;
  int ax1;
  int by2;
  int ay2;
  int bx2;
  int ax2;
  int histogram [35];
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8 [4];
  int local_c8 [38];
  
  if (x->gl_editor == (t_editor *)0x0) {
    bVar8 = false;
  }
  else {
    bVar8 = x->gl_editor->e_selection != (t_selection *)0x0;
  }
  data = canvas_undo_set_move(x,(uint)bVar8);
  canvas_undo_add(x,UNDO_MOTION,"{tidy up}",data);
  ptVar7 = x->gl_list;
  if (ptVar7 == (t_gobj *)0x0) {
    memset(local_d8 + 4,0,0x8c);
    iVar4 = 0;
  }
  else {
    do {
      if (bVar8 == false) {
LAB_00143922:
        gobj_getrect(ptVar7,x,&local_e0,&local_e4,local_d8 + 2,local_d8);
        ptVar6 = x->gl_list;
        if (ptVar6 != (t_gobj *)0x0) {
          do {
            if (bVar8 == false) {
LAB_00143973:
              gobj_getrect(ptVar6,x,&local_e8,&local_ec,local_d8 + 1,&local_dc);
              if ((local_e4 + -0x11 <= local_ec && local_ec <= local_e4 + 0x11) &&
                 (local_e8 < local_e0)) goto LAB_00143a39;
            }
            else if (x->gl_editor != (t_editor *)0x0) {
              for (ptVar3 = x->gl_editor->e_selection; ptVar3 != (t_selection *)0x0;
                  ptVar3 = ptVar3->sel_next) {
                if (ptVar3->sel_what == ptVar6) goto LAB_00143973;
              }
            }
            ptVar6 = ptVar6->g_next;
          } while (ptVar6 != (_gobj *)0x0);
          for (ptVar6 = x->gl_list; ptVar6 != (t_gobj *)0x0; ptVar6 = ptVar6->g_next) {
            if (bVar8 == false) {
LAB_001439ef:
              gobj_getrect(ptVar6,x,&local_e8,&local_ec,local_d8 + 1,&local_dc);
              if (((local_e4 - local_ec != 0) && (local_ec <= local_e4 + 0x11)) &&
                 (local_e4 + -0x11 <= local_ec)) {
                gobj_displace(ptVar6,x,0,local_e4 - local_ec);
              }
            }
            else if (x->gl_editor != (t_editor *)0x0) {
              for (ptVar3 = x->gl_editor->e_selection; ptVar3 != (t_selection *)0x0;
                  ptVar3 = ptVar3->sel_next) {
                if (ptVar3->sel_what == ptVar6) goto LAB_001439ef;
              }
            }
          }
        }
      }
      else if (x->gl_editor != (t_editor *)0x0) {
        for (ptVar3 = x->gl_editor->e_selection; ptVar3 != (t_selection *)0x0;
            ptVar3 = ptVar3->sel_next) {
          if (ptVar3->sel_what == ptVar7) goto LAB_00143922;
        }
      }
LAB_00143a39:
      ptVar7 = ptVar7->g_next;
    } while (ptVar7 != (_gobj *)0x0);
    ptVar7 = x->gl_list;
    memset(local_d8 + 4,0,0x8c);
    iVar4 = 0;
    if (ptVar7 != (t_gobj *)0x0) {
      do {
        if (bVar8 == false) {
LAB_00143a9e:
          gobj_getrect(ptVar7,x,&local_e0,&local_e4,local_d8 + 2,local_d8);
          for (ptVar6 = x->gl_list; ptVar6 != (t_gobj *)0x0; ptVar6 = ptVar6->g_next) {
            if (bVar8 == false) {
LAB_00143aeb:
              gobj_getrect(ptVar6,x,&local_e8,&local_ec,local_d8 + 1,&local_dc);
              if ((local_e0 + -0x12 <= local_e8 && local_e8 <= local_e0 + 0x12) &&
                 ((uint)(local_ec - local_d8[0]) < 0x23)) {
                local_d8[(ulong)(uint)(local_ec - local_d8[0]) + 4] =
                     local_d8[(ulong)(uint)(local_ec - local_d8[0]) + 4] + 1;
              }
            }
            else if (x->gl_editor != (t_editor *)0x0) {
              for (ptVar3 = x->gl_editor->e_selection; ptVar3 != (t_selection *)0x0;
                  ptVar3 = ptVar3->sel_next) {
                if (ptVar3->sel_what == ptVar6) goto LAB_00143aeb;
              }
            }
          }
        }
        else if (x->gl_editor != (t_editor *)0x0) {
          for (ptVar3 = x->gl_editor->e_selection; ptVar3 != (t_selection *)0x0;
              ptVar3 = ptVar3->sel_next) {
            if (ptVar3->sel_what == ptVar7) goto LAB_00143a9e;
          }
        }
        ptVar7 = ptVar7->g_next;
        iVar4 = local_c8[2];
      } while (ptVar7 != (_gobj *)0x0);
    }
  }
  iVar2 = 0;
  local_d8[3] = 4;
  lVar5 = 4;
  do {
    iVar1 = iVar4 * 3;
    iVar4 = local_d8[lVar5 + 3];
    iVar1 = iVar1 + local_d8[lVar5] + local_d8[lVar5 + 4] + (local_d8[lVar5 + 1] + iVar4) * 2;
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
      local_d8[3] = (int)lVar5 + -2;
    }
    lVar5 = lVar5 + 1;
  } while ((int)lVar5 != 0x23);
  logpost((void *)0x0,3,"tidy: best vertical distance %d");
  ptVar7 = x->gl_list;
  if (ptVar7 != (t_gobj *)0x0) {
    do {
      if (bVar8 == false) {
LAB_00143c01:
        gobj_getrect(ptVar7,x,&local_e0,&local_e4,local_d8 + 2,local_d8);
        for (ptVar6 = x->gl_list; ptVar6 != (t_gobj *)0x0; ptVar6 = ptVar6->g_next) {
          if (bVar8 == false) {
LAB_00143c52:
            gobj_getrect(ptVar6,x,&local_e8,&local_ec,local_d8 + 1,&local_dc);
            if ((local_e0 + -0x12 <= local_e8 && local_e8 <= local_e0 + 0x12) &&
               (local_dc + -10 <= local_e4 && local_e4 < local_dc + 0x23)) goto LAB_00143d74;
          }
          else if (x->gl_editor != (t_editor *)0x0) {
            for (ptVar3 = x->gl_editor->e_selection; ptVar3 != (t_selection *)0x0;
                ptVar3 = ptVar3->sel_next) {
              if (ptVar3->sel_what == ptVar6) goto LAB_00143c52;
            }
          }
        }
LAB_00143cb2:
        ptVar6 = x->gl_list;
        do {
          if (ptVar6 == (t_gobj *)0x0) goto LAB_00143d74;
          if (bVar8 == false) {
LAB_00143ce4:
            gobj_getrect(ptVar6,x,&local_e8,&local_ec,local_d8 + 1,&local_dc);
            if (((local_e0 + -0x12 <= local_e8 && local_e8 <= local_e0 + 0x12) &&
                (local_e4 < local_ec)) && (local_ec < local_d8[0] + 0x23)) goto LAB_00143d3b;
          }
          else if (x->gl_editor != (t_editor *)0x0) {
            for (ptVar3 = x->gl_editor->e_selection; ptVar3 != (t_selection *)0x0;
                ptVar3 = ptVar3->sel_next) {
              if (ptVar3->sel_what == ptVar6) goto LAB_00143ce4;
            }
          }
          ptVar6 = ptVar6->g_next;
        } while( true );
      }
      if (x->gl_editor != (t_editor *)0x0) {
        for (ptVar3 = x->gl_editor->e_selection; ptVar3 != (t_selection *)0x0;
            ptVar3 = ptVar3->sel_next) {
          if (ptVar3->sel_what == ptVar7) goto LAB_00143c01;
        }
      }
LAB_00143d74:
      ptVar7 = ptVar7->g_next;
    } while (ptVar7 != (_gobj *)0x0);
  }
  canvas_dirty(x,1.0);
  return;
LAB_00143d3b:
  iVar4 = (local_d8[3] - local_ec) + local_d8[0];
  gobj_displace(ptVar6,x,local_e0 - local_e8,iVar4);
  local_e4 = local_ec + iVar4;
  local_d8[0] = iVar4 + local_dc;
  goto LAB_00143cb2;
}

Assistant:

static void canvas_tidy(t_canvas *x)
{
    t_gobj *y, *y2;
    int ax1, ay1, ax2, ay2, bx1, by1, bx2, by2;
    int histogram[NHIST], *ip, i, besthist, bestdist;
        /* if nobody is selected, this means do it to all boxes;
           otherwise just the selection */
    int all = (x->gl_editor ? (x->gl_editor->e_selection == 0) : 1);

    canvas_undo_add(x, UNDO_MOTION, "{tidy up}", canvas_undo_set_move(x, !all));

        /* tidy horizontally */
    for (y = x->gl_list; y; y = y->g_next)
        if (all || glist_isselected(x, y))
        {
            gobj_getrect(y, x, &ax1, &ay1, &ax2, &ay2);

            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (by1 <= ay1 + YTOLERANCE && by1 >= ay1 - YTOLERANCE &&
                        bx1 < ax1)
                        goto nothorizhead;
                }

            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (by1 <= ay1 + YTOLERANCE && by1 >= ay1 - YTOLERANCE
                        && by1 != ay1)
                        gobj_displace(y2, x, 0, ay1-by1);
                }
        nothorizhead: ;
        }
        /* tidy vertically.  First guess the user's favorite vertical spacing */
    for (i = NHIST, ip = histogram; i--; ip++) *ip = 0;
    for (y = x->gl_list; y; y = y->g_next)
        if (all || glist_isselected(x, y))
        {
            gobj_getrect(y, x, &ax1, &ay1, &ax2, &ay2);
            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (bx1 <= ax1 + XTOLERANCE && bx1 >= ax1 - XTOLERANCE)
                    {
                        int distance = by1-ay2;
                        if (distance >= 0 && distance < NHIST)
                            histogram[distance]++;
                    }
                }
        }
    for (i = 2, besthist = 0, bestdist = 4, ip = histogram + 2;
         i < (NHIST-2); i++, ip++)
    {
        int hit = ip[-2] + 2 * ip[-1] + 3 * ip[0] + 2* ip[1] + ip[2];
        if (hit > besthist)
        {
            besthist = hit;
            bestdist = i;
        }
    }
    logpost(NULL, 3, "tidy: best vertical distance %d", bestdist);
    for (y = x->gl_list; y; y = y->g_next)
        if (all || glist_isselected(x, y))
        {
            int keep = 1;
            gobj_getrect(y, x, &ax1, &ay1, &ax2, &ay2);
            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (bx1 <= ax1 + XTOLERANCE && bx1 >= ax1 - XTOLERANCE &&
                        ay1 >= by2 - 10 && ay1 < by2 + NHIST)
                        goto nothead;
                }
            while (keep)
            {
                keep = 0;
                for (y2 = x->gl_list; y2; y2 = y2->g_next)
                    if (all || glist_isselected(x, y2))
                    {
                        gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                        if (bx1 <= ax1 + XTOLERANCE && bx1 >= ax1 - XTOLERANCE &&
                            by1 > ay1 && by1 < ay2 + NHIST)
                        {
                            int vmove = ay2 + bestdist - by1;
                            gobj_displace(y2, x, ax1-bx1, vmove);
                            ay1 = by1 + vmove;
                            ay2 = by2 + vmove;
                            keep = 1;
                            break;
                        }
                    }
            }
        nothead: ;
        }
    canvas_dirty(x, 1);
}